

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program_types.cpp
# Opt level: O3

bool __thiscall Clasp::Asp::SccChecker::recurse(SccChecker *this,Call *c)

{
  ulong *puVar1;
  ulong uVar2;
  PrgBody *n;
  PrgAtom *pPVar3;
  PrgNode PVar4;
  bool bVar5;
  ulong *puVar6;
  ulong *puVar7;
  long lVar8;
  ulong uVar9;
  uint *puVar10;
  uint uVar11;
  uint *puVar12;
  PrgAtom *a;
  ulong *puVar13;
  
  uVar9 = c->node;
  puVar13 = (ulong *)(uVar9 & 0xfffffffffffffffc);
  if (-1 < (long)*puVar13) {
    bk_lib::pod_vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (&this->nodeStack_,&c->node);
    uVar11 = this->count_;
    this->count_ = uVar11 + 1;
    c->min = uVar11;
    *puVar13 = *puVar13 & 0x30000000ffffffff | (ulong)(uVar11 & 0xfffffff) << 0x20 |
               0x8000000000000000;
    uVar9 = c->node;
  }
  switch((uint)uVar9 & 3) {
  case 0:
    uVar9 = puVar13[5];
    if (c->next != (uint)uVar9) {
      uVar2 = puVar13[4];
      lVar8 = (ulong)c->next << 2;
      do {
        uVar11 = *(uint *)(uVar2 + lVar8);
        if ((((uVar11 & 2) == 0) &&
            (n = (this->prg_->bodies_).ebo_.buf[uVar11 >> 2], PVar4 = n->super_PrgNode,
            (PVar4._0_4_ & 0x7fffffff) != 1 && ((ulong)PVar4 & 0x4000000080000000) == 0)) &&
           (bVar5 = onNode(this,&n->super_PrgNode,Body,c,(uint32)((lVar8 + uVar2) - puVar13[4] >> 2)
                          ), bVar5)) {
          return true;
        }
        lVar8 = lVar8 + 4;
      } while ((ulong)(uint)uVar9 << 2 != lVar8);
    }
    break;
  case 1:
    puVar1 = puVar13 + 2;
    if ((~(uint)puVar13[1] & 0x6000000) == 0) {
      puVar7 = *(ulong **)*puVar1;
      puVar10 = (uint *)((long)puVar7 + (ulong)c->next * 4);
      uVar11 = *(uint *)((undefined8 *)*puVar1 + 1);
    }
    else {
      puVar10 = (uint *)((ulong)c->next * 4 + (long)puVar1);
      uVar11 = (uint)puVar13[1] >> 0x19 & 3;
      puVar7 = puVar1;
    }
    puVar12 = puVar10;
    for (; puVar10 != (uint *)((long)puVar7 + (ulong)uVar11 * 4); puVar10 = puVar10 + 1) {
      bVar5 = (*puVar10 & 0xc) != 0;
      pPVar3 = (&this->prg_->atoms_)[bVar5].ebo_.buf[*puVar10 >> 4];
      PVar4 = (pPVar3->super_PrgHead).super_PrgNode;
      if ((PVar4._0_4_ & 0x7fffffff) != 1 && ((ulong)PVar4 & 0x4000000080000000) == 0) {
        puVar6 = puVar1;
        if ((~(uint)puVar13[1] & 0x6000000) == 0) {
          puVar6 = *(ulong **)*puVar1;
        }
        bVar5 = onNode(this,(PrgNode *)pPVar3,(uint)bVar5 * 2,c,
                       (uint32)((ulong)((long)puVar12 - (long)puVar6) >> 2));
        if (bVar5) {
          return true;
        }
      }
      puVar12 = puVar12 + 1;
    }
    break;
  case 2:
    uVar11 = (uint)puVar13[3] & 0x7ffffff;
    if (c->next != uVar11) {
      uVar9 = (ulong)c->next << 2;
      do {
        pPVar3 = (this->prg_->atoms_).ebo_.buf[*(uint *)((long)puVar13 + uVar9 + 0x1c)];
        PVar4 = (pPVar3->super_PrgHead).super_PrgNode;
        if (((PVar4._0_4_ & 0x7fffffff) != 1 && ((ulong)PVar4 & 0x4000000080000000) == 0) &&
           (bVar5 = onNode(this,(PrgNode *)pPVar3,Atom,c,(uint32)(uVar9 >> 2)), bVar5)) {
          return true;
        }
        uVar9 = uVar9 + 4;
      } while (uVar11 << 2 != uVar9);
    }
  }
  return false;
}

Assistant:

bool SccChecker::recurse(Call& c) {
	PrgNode* n = unpackNode(c.node);
	if (!n->seen()) {
		nodeStack_.push_back(c.node);
		c.min = count_++;
		n->resetId(c.min, true);
	}
	if (isNode(c.node, PrgNode::Body)) {
		PrgBody* b = static_cast<PrgBody*>(n);
		PrgHead* h = 0; NodeType t;
		for (PrgBody::head_iterator it = b->heads_begin() + c.next, end = b->heads_end(); it != end; ++it) {
			if   (it->isAtom()){ h = prg_->getAtom(it->node()); t = PrgNode::Atom; }
			else               { h = prg_->getDisj(it->node()); t = PrgNode::Disj; }
			if (doVisit(h, false) && onNode(h, t, c, static_cast<uint32>(it-b->heads_begin()))) {
				return true;
			}
		}
	}
	else if (isNode(c.node, PrgNode::Atom)) {
		PrgAtom* a = static_cast<PrgAtom*>(n);
		for (PrgAtom::dep_iterator it = a->deps_begin() + c.next, end = a->deps_end(); it != end; ++it) {
			if (it->sign()) continue;
			PrgBody* bn = prg_->getBody(it->var());
			if (doVisit(bn, false) && onNode(bn, PrgNode::Body, c, static_cast<uint32>(it-a->deps_begin()))) {
				return true;
			}
		}
	}
	else if (isNode(c.node, PrgNode::Disj)) {
		PrgDisj* d = static_cast<PrgDisj*>(n);
		for (PrgDisj::atom_iterator it = d->begin() + c.next, end = d->end(); it != end; ++it) {
			PrgAtom* a = prg_->getAtom(*it);
			if (doVisit(a, false) && onNode(a, PrgNode::Atom, c, static_cast<uint32>(it-d->begin()))) {
				return true;
			}
		}
	}
	return false;
}